

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O3

ze_result_t
tracing_layer::zeCommandListAppendImageCopyToMemory
          (ze_command_list_handle_t hCommandList,void *dstptr,ze_image_handle_t hSrcImage,
          ze_image_region_t *pSrcRegion,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  ulong uVar1;
  _func_void__ze_command_list_append_image_copy_to_memory_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var2;
  _func__ze_result_t__ze_command_list_handle_t_ptr_void_ptr__ze_image_handle_t_ptr__ze_image_region_t_ptr__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
  *zeApiPtr;
  ze_event_handle_t *pp_Var3;
  _ze_result_t _Var4;
  char *pcVar5;
  ulong *puVar6;
  long lVar7;
  ulong uVar8;
  uint32_t numWaitEvents_local;
  uint32_t local_134;
  ze_event_handle_t hSignalEvent_local;
  ze_image_region_t *pSrcRegion_local;
  ze_image_handle_t hSrcImage_local;
  void *dstptr_local;
  ze_command_list_handle_t hCommandList_local;
  APITracerCallbackDataImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_b8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_a0;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_command_list_append_image_copy_to_memory_params_t tracerParams;
  
  pp_Var3 = phWaitEvents;
  if (DAT_001833b0 ==
      (_func__ze_result_t__ze_command_list_handle_t_ptr_void_ptr__ze_image_handle_t_ptr__ze_image_region_t_ptr__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
       *)0x0) {
    _Var4 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    numWaitEvents_local = numWaitEvents;
    local_134 = numWaitEvents;
    hSignalEvent_local = hSignalEvent;
    pSrcRegion_local = pSrcRegion;
    hSrcImage_local = hSrcImage;
    dstptr_local = dstptr;
    hCommandList_local = hCommandList;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar5 = (char *)__tls_get_addr(&PTR_00182fa0);
    if (*pcVar5 == '\0') {
      tracing_layer::tracingInProgress::__tls_init();
      *pcVar5 = '\x01';
      tracerParams.phCommandList = &hCommandList_local;
      tracerParams.pdstptr = &dstptr_local;
      tracerParams.phSrcImage = &hSrcImage_local;
      tracerParams.ppSrcRegion = &pSrcRegion_local;
      tracerParams.phSignalEvent = &hSignalEvent_local;
      tracerParams.pphWaitEvents = &phWaitEvents;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      apiCallbackData.apiOrdinal =
           (_func_void__ze_command_list_append_image_copy_to_memory_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
            *)0x0;
      apiCallbackData.prologCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tracerParams.pnumWaitEvents = &numWaitEvents_local;
      puVar6 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if ((puVar6 != (ulong *)0x0) && (*puVar6 != 0)) {
        lVar7 = 0xcb0;
        uVar8 = 0;
        do {
          uVar1 = puVar6[1];
          prologCallback.current_api_callback =
               *(_func_void__ze_command_list_append_image_copy_to_memory_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)((uVar1 - 0xa30) + lVar7);
          p_Var2 = *(_func_void__ze_command_list_append_image_copy_to_memory_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)((uVar1 - 0x3d8) + lVar7);
          prologCallback.pUserData = *(void **)(uVar1 + lVar7);
          if (apiCallbackData.prologCallbacks.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              apiCallbackData.prologCallbacks.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>>>
            ::
            _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>const&>
                      ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>>>
                        *)&apiCallbackData.prologCallbacks,
                       (iterator)
                       apiCallbackData.prologCallbacks.
                       super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&prologCallback);
          }
          else {
            (apiCallbackData.prologCallbacks.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
                 prologCallback.current_api_callback;
            (apiCallbackData.prologCallbacks.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->pUserData = prologCallback.pUserData;
            apiCallbackData.prologCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 apiCallbackData.prologCallbacks.
                 super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          epilogCallback.pUserData = *(void **)(puVar6[1] + lVar7);
          epilogCallback.current_api_callback = p_Var2;
          if (apiCallbackData.epilogCallbacks.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              apiCallbackData.epilogCallbacks.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>>>
            ::
            _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>const&>
                      ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>>>
                        *)&apiCallbackData.epilogCallbacks,
                       (iterator)
                       apiCallbackData.epilogCallbacks.
                       super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&epilogCallback);
          }
          else {
            (apiCallbackData.epilogCallbacks.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var2;
            (apiCallbackData.epilogCallbacks.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->pUserData = epilogCallback.pUserData;
            apiCallbackData.epilogCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 apiCallbackData.epilogCallbacks.
                 super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0xcb8;
        } while (uVar8 < *puVar6);
      }
      p_Var2 = apiCallbackData.apiOrdinal;
      zeApiPtr = DAT_001833b0;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_a0,&apiCallbackData.prologCallbacks);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_b8,&apiCallbackData.epilogCallbacks);
      _Var4 = APITracerWrapperImp<_ze_result_t(*)(_ze_command_list_handle_t*,void*,_ze_image_handle_t*,_ze_image_region_t_const*,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t**),_ze_command_list_append_image_copy_to_memory_params_t*,void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_to_memory_params_t*,_ze_result_t,void*,void**)>>>,_ze_command_list_handle_t*&,void*&,_ze_image_handle_t*&,_ze_image_region_t_const*&,_ze_event_handle_t*&,unsigned_int&,_ze_event_handle_t**&>
                        (zeApiPtr,&tracerParams,p_Var2,&local_a0,&local_b8,&hCommandList_local,
                         &dstptr_local,&hSrcImage_local,&pSrcRegion_local,&hSignalEvent_local,
                         &numWaitEvents_local,&phWaitEvents);
      if (local_b8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (apiCallbackData.epilogCallbacks.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(apiCallbackData.epilogCallbacks.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)apiCallbackData.epilogCallbacks.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)apiCallbackData.epilogCallbacks.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (apiCallbackData.prologCallbacks.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(apiCallbackData.prologCallbacks.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)apiCallbackData.prologCallbacks.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)apiCallbackData.prologCallbacks.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_to_memory_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      _Var4 = (*DAT_001833b0)(hCommandList,dstptr,hSrcImage,pSrcRegion,hSignalEvent,local_134,
                              pp_Var3);
    }
  }
  return _Var4;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendImageCopyToMemory(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        void* dstptr,                                   ///< [in] pointer to destination memory to copy to
        ze_image_handle_t hSrcImage,                    ///< [in] handle of source image to copy from
        const ze_image_region_t* pSrcRegion,            ///< [in][optional] source region descriptor
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        auto pfnAppendImageCopyToMemory = context.zeDdiTable.CommandList.pfnAppendImageCopyToMemory;

        if( nullptr == pfnAppendImageCopyToMemory)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.CommandList.pfnAppendImageCopyToMemory, hCommandList, dstptr, hSrcImage, pSrcRegion, hSignalEvent, numWaitEvents, phWaitEvents);

        // capture parameters
        ze_command_list_append_image_copy_to_memory_params_t tracerParams = {
            &hCommandList,
            &dstptr,
            &hSrcImage,
            &pSrcRegion,
            &hSignalEvent,
            &numWaitEvents,
            &phWaitEvents
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnCommandListAppendImageCopyToMemoryCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnCommandListAppendImageCopyToMemoryCb_t, CommandList, pfnAppendImageCopyToMemoryCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.CommandList.pfnAppendImageCopyToMemory,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phCommandList,
                                                  *tracerParams.pdstptr,
                                                  *tracerParams.phSrcImage,
                                                  *tracerParams.ppSrcRegion,
                                                  *tracerParams.phSignalEvent,
                                                  *tracerParams.pnumWaitEvents,
                                                  *tracerParams.pphWaitEvents);
    }